

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe46At7(uint8_t *buf)

{
  return (ulong)((uint)buf[2] | (uint)buf[1] << 8 | (*buf & 1) << 0x10) << 0x1d |
         (ulong)((uint)buf[4] << 0xd | (uint)buf[3] << 0x15) | (ulong)buf[5] << 5 |
         (ulong)(buf[6] >> 3);
}

Assistant:

std::uint64_t readFlUIntBe46At7(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[5];
    res <<= 5;
    res |= (buf[6] >> 3);
    res &= UINT64_C(0x3fffffffffff);
    return res;
}